

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void getSystemContentScale(float *xscale,float *yscale)

{
  int iVar1;
  float *in_RSI;
  float *in_RDI;
  double dVar2;
  char *type;
  XrmValue value;
  XrmDatabase db;
  char *rms;
  float ydpi;
  float xdpi;
  char *local_40;
  XrmValue local_38;
  XrmDatabase local_28;
  char *local_20;
  float local_18;
  float local_14;
  float *local_10;
  float *local_8;
  
  local_14 = 96.0;
  local_18 = 96.0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = (*_glfw.x11.xlib.ResourceManagerString)(_glfw.x11.display);
  if ((local_20 != (char *)0x0) &&
     (local_28 = (*_glfw.x11.xrm.GetStringDatabase)(local_20), local_28 != (XrmDatabase)0x0)) {
    local_40 = (char *)0x0;
    iVar1 = (*_glfw.x11.xrm.GetResource)(local_28,"Xft.dpi","Xft.Dpi",&local_40,&local_38);
    if ((iVar1 != 0) &&
       ((local_40 != (char *)0x0 && (iVar1 = strcmp(local_40,"String"), iVar1 == 0)))) {
      dVar2 = atof(local_38.addr);
      local_18 = (float)dVar2;
      local_14 = local_18;
    }
    (*_glfw.x11.xrm.DestroyDatabase)(local_28);
  }
  *local_8 = local_14 / 96.0;
  *local_10 = local_18 / 96.0;
  return;
}

Assistant:

static void getSystemContentScale(float* xscale, float* yscale)
{
    // Start by assuming the default X11 DPI
    // NOTE: Some desktop environments (KDE) may remove the Xft.dpi field when it
    //       would be set to 96, so assume that is the case if we cannot find it
    float xdpi = 96.f, ydpi = 96.f;

    // NOTE: Basing the scale on Xft.dpi where available should provide the most
    //       consistent user experience (matches Qt, Gtk, etc), although not
    //       always the most accurate one
    char* rms = XResourceManagerString(_glfw.x11.display);
    if (rms)
    {
        XrmDatabase db = XrmGetStringDatabase(rms);
        if (db)
        {
            XrmValue value;
            char* type = NULL;

            if (XrmGetResource(db, "Xft.dpi", "Xft.Dpi", &type, &value))
            {
                if (type && strcmp(type, "String") == 0)
                    xdpi = ydpi = atof(value.addr);
            }

            XrmDestroyDatabase(db);
        }
    }

    *xscale = xdpi / 96.f;
    *yscale = ydpi / 96.f;
}